

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

ostream * L12_1::operator<<(ostream *os,String *str)

{
  std::operator<<(os,str->_p_str);
}

Assistant:

std::ostream& operator<<(std::ostream &os, const String &str) {
        os << str._p_str;
        return os;
    }